

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

Message * __thiscall
google::protobuf::Reflection::AddMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  bool bVar1;
  Label LVar2;
  CppType CVar3;
  int iVar4;
  Descriptor *pDVar5;
  Type *value;
  undefined8 uVar6;
  undefined4 extraout_var;
  Reflection *in_RCX;
  FieldDescriptor *in_RDX;
  long *in_RSI;
  Message *in_RDI;
  Message *prototype;
  RepeatedPtrFieldBase *repeated;
  Message *result;
  Descriptor *in_stack_00000050;
  undefined4 in_stack_00000058;
  int in_stack_0000005c;
  RepeatedPtrFieldBase *in_stack_00000060;
  RepeatedPtrFieldBase *in_stack_ffffffffffffffa8;
  Reflection *in_stack_ffffffffffffffb0;
  Reflection *in_stack_ffffffffffffffc0;
  RepeatedPtrFieldBase *local_38;
  MessageLite *local_30;
  Reflection *local_28;
  MessageLite *local_8;
  
  pDVar5 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar5 != (Descriptor *)(in_RDI->super_MessageLite)._vptr_MessageLite) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000050,(FieldDescriptor *)this,(char *)message,(char *)field);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 != LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000050,(FieldDescriptor *)this,(char *)message,(char *)field);
  }
  CVar3 = FieldDescriptor::cpp_type((FieldDescriptor *)0x6d77ff);
  if (CVar3 != CPPTYPE_MESSAGE) {
    anon_unknown_0::ReportReflectionUsageTypeError
              ((Descriptor *)in_stack_00000060,
               (FieldDescriptor *)CONCAT44(in_stack_0000005c,in_stack_00000058),
               (char *)in_stack_00000050,this._4_4_);
  }
  local_28 = in_RCX;
  if (in_RCX == (Reflection *)0x0) {
    local_28 = (Reflection *)in_RDI[8].super_MessageLite._vptr_MessageLite;
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    MutableExtensionSet(in_stack_ffffffffffffffb0,(Message *)in_stack_ffffffffffffffa8);
    local_8 = internal::ExtensionSet::AddMessage((ExtensionSet *)message,field,factory);
  }
  else {
    bVar1 = anon_unknown_0::IsMapFieldInApi((FieldDescriptor *)0x6d788f);
    if (bVar1) {
      MutableRaw<google::protobuf::internal::MapFieldBase>
                (in_stack_ffffffffffffffc0,in_RDI,(FieldDescriptor *)in_stack_ffffffffffffffb0);
      local_38 = internal::MapFieldBase::MutableRepeatedField
                           ((MapFieldBase *)in_stack_ffffffffffffffb0);
    }
    else {
      local_38 = MutableRaw<google::protobuf::internal::RepeatedPtrFieldBase>
                           (in_stack_ffffffffffffffc0,in_RDI,
                            (FieldDescriptor *)in_stack_ffffffffffffffb0);
    }
    local_30 = &internal::RepeatedPtrFieldBase::
                AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                          (in_stack_ffffffffffffffa8)->super_MessageLite;
    if (local_30 == (MessageLite *)0x0) {
      iVar4 = internal::RepeatedPtrFieldBase::size(local_38);
      if (iVar4 == 0) {
        pDVar5 = FieldDescriptor::message_type((FieldDescriptor *)local_28);
        value = (Type *)(**(code **)(local_28->descriptor_ + 0x10))(local_28,pDVar5);
        in_stack_ffffffffffffffb0 = local_28;
      }
      else {
        value = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                          (in_stack_00000060,in_stack_0000005c);
      }
      uVar6 = (**(code **)(*in_RSI + 0x28))();
      iVar4 = (*(value->super_MessageLite)._vptr_MessageLite[4])(value,uVar6);
      local_30 = (MessageLite *)CONCAT44(extraout_var,iVar4);
      internal::RepeatedPtrFieldBase::
      UnsafeArenaAddAllocated<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                ((RepeatedPtrFieldBase *)in_stack_ffffffffffffffb0,value);
    }
    local_8 = local_30;
  }
  return (Message *)local_8;
}

Assistant:

Message* Reflection::AddMessage(Message* message, const FieldDescriptor* field,
                                MessageFactory* factory) const {
  USAGE_CHECK_ALL(AddMessage, REPEATED, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->AddMessage(field, factory));
  } else {
    Message* result = nullptr;

    // We can't use AddField<Message>() because RepeatedPtrFieldBase doesn't
    // know how to allocate one.
    RepeatedPtrFieldBase* repeated = nullptr;
    if (IsMapFieldInApi(field)) {
      repeated =
          MutableRaw<MapFieldBase>(message, field)->MutableRepeatedField();
    } else {
      repeated = MutableRaw<RepeatedPtrFieldBase>(message, field);
    }
    result = repeated->AddFromCleared<GenericTypeHandler<Message> >();
    if (result == nullptr) {
      // We must allocate a new object.
      const Message* prototype;
      if (repeated->size() == 0) {
        prototype = factory->GetPrototype(field->message_type());
      } else {
        prototype = &repeated->Get<GenericTypeHandler<Message> >(0);
      }
      result = prototype->New(message->GetArena());
      // We can guarantee here that repeated and result are either both heap
      // allocated or arena owned. So it is safe to call the unsafe version
      // of AddAllocated.
      repeated->UnsafeArenaAddAllocated<GenericTypeHandler<Message> >(result);
    }

    return result;
  }
}